

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O2

void deqp::gles2::Functional::DepthStencilCaseUtil::generateDepthVisualizeCommands
               (TestRenderTarget *target,
               vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
               *commands)

{
  float *pfVar1;
  int ndx;
  long lVar2;
  RenderCommand local_a4;
  
  pfVar1 = generateDepthVisualizeCommands::depthSteps;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    RenderCommand::RenderCommand(&local_a4);
    local_a4.params.visibleFace = FACETYPE_FRONT;
    local_a4.rect.left = 0;
    local_a4.rect.bottom = 0;
    local_a4.rect.width = target->width;
    local_a4.rect.height = target->height;
    local_a4.color.m_data[0] = 0.0;
    local_a4.color.m_data[1] = 0.0;
    local_a4.color.m_data[2] = (float)(int)lVar2 * 0.25;
    local_a4.color.m_data[3] = 0.0;
    local_a4.colorMask.m_data[0] = false;
    local_a4.colorMask.m_data[1] = false;
    local_a4.colorMask.m_data[2] = true;
    local_a4.colorMask.m_data[3] = false;
    local_a4.params.depth = *pfVar1 + -0.05;
    local_a4.params.depthTestEnabled = true;
    local_a4.params.depthFunc = 0x201;
    local_a4.params.depthWriteMask = false;
    std::
    vector<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
    ::push_back(commands,&local_a4);
    pfVar1 = pfVar1 + 1;
  }
  return;
}

Assistant:

void generateDepthVisualizeCommands (const TestRenderTarget& target, vector<RenderCommand>& commands)
{
	const float			epsilon			= -0.05f;
	static const float	depthSteps[]	= {-1.0f, -0.5f, 0.0f, 0.5f, 1.0f};
	int					numSteps		= DE_LENGTH_OF_ARRAY(depthSteps);
	const float			colorStep		= 1.0f / (float)(numSteps-1);

	for (int ndx = 0; ndx < numSteps; ndx++)
	{
		RenderCommand cmd;

		cmd.params.visibleFace		= rr::FACETYPE_FRONT;
		cmd.rect					= rr::WindowRectangle(0, 0, target.width, target.height);
		cmd.color					= Vec4(0.0f, 0.0f, colorStep*(float)ndx, 0.0f);
		cmd.colorMask				= tcu::BVec4(false, false, true, false);
		cmd.params.depth			= depthSteps[ndx]+epsilon;
		cmd.params.depthTestEnabled	= true;
		cmd.params.depthFunc		= GL_LESS;
		cmd.params.depthWriteMask	= false;

		commands.push_back(cmd);
	}
}